

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O0

void flat_mask_internal(__m128i *th,__m128i *pq,int start,int end,__m128i *flat)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ushort local_278;
  ushort uStack_276;
  ushort uStack_274;
  ushort uStack_272;
  ushort uStack_270;
  ushort uStack_26e;
  ushort uStack_26c;
  ushort uStack_26a;
  int local_25c;
  short local_218;
  short sStack_216;
  short sStack_214;
  short sStack_212;
  short sStack_210;
  short sStack_20e;
  short sStack_20c;
  short sStack_20a;
  ulong local_1e8;
  ulong uStack_1e0;
  ulong local_1d8;
  ulong uStack_1d0;
  ulong local_1a8;
  ulong uStack_1a0;
  ulong local_198;
  ulong uStack_190;
  ulong local_168;
  ulong uStack_160;
  ulong local_158;
  ulong uStack_150;
  __m128i zero;
  __m128i ft;
  __m128i max;
  short sStack_48;
  short sStack_46;
  int i;
  __m128i *flat_local;
  int end_local;
  int start_local;
  __m128i *pq_local;
  __m128i *th_local;
  short sStack_20;
  short sStack_1e;
  short sStack_1c;
  short sStack_1a;
  short local_18;
  short sStack_16;
  short sStack_14;
  short sStack_12;
  short sStack_10;
  short sStack_e;
  short sStack_c;
  short sStack_a;
  
  auVar2 = psubusw((undefined1  [16])pq[start],(undefined1  [16])*pq);
  auVar1 = psubusw((undefined1  [16])*pq,(undefined1  [16])pq[start]);
  local_158 = auVar2._0_8_;
  uStack_150 = auVar2._8_8_;
  local_168 = auVar1._0_8_;
  uStack_160 = auVar1._8_8_;
  local_158 = local_158 | local_168;
  uStack_150 = uStack_150 | uStack_160;
  auVar2 = psubusw((undefined1  [16])pq[start + 1],(undefined1  [16])*pq);
  auVar1 = psubusw((undefined1  [16])*pq,(undefined1  [16])pq[start + 1]);
  local_198 = auVar2._0_8_;
  uStack_190 = auVar2._8_8_;
  local_1a8 = auVar1._0_8_;
  uStack_1a0 = auVar1._8_8_;
  local_198 = local_198 | local_1a8;
  uStack_190 = uStack_190 | uStack_1a0;
  local_18 = (short)local_158;
  sStack_16 = (short)(local_158 >> 0x10);
  sStack_14 = (short)(local_158 >> 0x20);
  sStack_12 = (short)(local_158 >> 0x30);
  sStack_10 = (short)uStack_150;
  sStack_e = (short)(uStack_150 >> 0x10);
  sStack_c = (short)(uStack_150 >> 0x20);
  sStack_a = (short)(uStack_150 >> 0x30);
  th_local._0_2_ = (short)local_198;
  th_local._2_2_ = (short)(local_198 >> 0x10);
  th_local._4_2_ = (short)(local_198 >> 0x20);
  th_local._6_2_ = (short)(local_198 >> 0x30);
  sStack_20 = (short)uStack_190;
  sStack_1e = (short)(uStack_190 >> 0x10);
  sStack_1c = (short)(uStack_190 >> 0x20);
  sStack_1a = (short)(uStack_190 >> 0x30);
  local_278 = (ushort)(local_18 < (short)th_local) * (short)th_local |
              (ushort)(local_18 >= (short)th_local) * local_18;
  uStack_276 = (ushort)(sStack_16 < th_local._2_2_) * th_local._2_2_ |
               (ushort)(sStack_16 >= th_local._2_2_) * sStack_16;
  uStack_274 = (ushort)(sStack_14 < th_local._4_2_) * th_local._4_2_ |
               (ushort)(sStack_14 >= th_local._4_2_) * sStack_14;
  uStack_272 = (ushort)(sStack_12 < th_local._6_2_) * th_local._6_2_ |
               (ushort)(sStack_12 >= th_local._6_2_) * sStack_12;
  uStack_270 = (ushort)(sStack_10 < sStack_20) * sStack_20 |
               (ushort)(sStack_10 >= sStack_20) * sStack_10;
  uStack_26e = (ushort)(sStack_e < sStack_1e) * sStack_1e |
               (ushort)(sStack_e >= sStack_1e) * sStack_e;
  uStack_26c = (ushort)(sStack_c < sStack_1c) * sStack_1c |
               (ushort)(sStack_c >= sStack_1c) * sStack_c;
  uStack_26a = (ushort)(sStack_a < sStack_1a) * sStack_1a |
               (ushort)(sStack_a >= sStack_1a) * sStack_a;
  for (local_25c = start + 2; local_25c < end; local_25c = local_25c + 1) {
    auVar2 = psubusw((undefined1  [16])pq[local_25c],(undefined1  [16])*pq);
    auVar1 = psubusw((undefined1  [16])*pq,(undefined1  [16])pq[local_25c]);
    local_1d8 = auVar2._0_8_;
    uStack_1d0 = auVar2._8_8_;
    local_1e8 = auVar1._0_8_;
    uStack_1e0 = auVar1._8_8_;
    local_1d8 = local_1d8 | local_1e8;
    uStack_1d0 = uStack_1d0 | uStack_1e0;
    sStack_48 = (short)local_1d8;
    sStack_46 = (short)(local_1d8 >> 0x10);
    i._0_2_ = (short)(local_1d8 >> 0x20);
    i._2_2_ = (short)(local_1d8 >> 0x30);
    flat_local._0_2_ = (short)uStack_1d0;
    flat_local._2_2_ = (short)(uStack_1d0 >> 0x10);
    flat_local._4_2_ = (short)(uStack_1d0 >> 0x20);
    flat_local._6_2_ = (short)(uStack_1d0 >> 0x30);
    local_278 = (ushort)((short)local_278 < sStack_48) * sStack_48 |
                ((short)local_278 >= sStack_48) * local_278;
    uStack_276 = (ushort)((short)uStack_276 < sStack_46) * sStack_46 |
                 ((short)uStack_276 >= sStack_46) * uStack_276;
    uStack_274 = (ushort)((short)uStack_274 < (short)i) * (short)i |
                 ((short)uStack_274 >= (short)i) * uStack_274;
    uStack_272 = (ushort)((short)uStack_272 < i._2_2_) * i._2_2_ |
                 ((short)uStack_272 >= i._2_2_) * uStack_272;
    uStack_270 = (ushort)((short)uStack_270 < (short)flat_local) * (short)flat_local |
                 ((short)uStack_270 >= (short)flat_local) * uStack_270;
    uStack_26e = (ushort)((short)uStack_26e < flat_local._2_2_) * flat_local._2_2_ |
                 ((short)uStack_26e >= flat_local._2_2_) * uStack_26e;
    uStack_26c = (ushort)((short)uStack_26c < flat_local._4_2_) * flat_local._4_2_ |
                 ((short)uStack_26c >= flat_local._4_2_) * uStack_26c;
    uStack_26a = (ushort)((short)uStack_26a < flat_local._6_2_) * flat_local._6_2_ |
                 ((short)uStack_26a >= flat_local._6_2_) * uStack_26a;
  }
  auVar1._2_2_ = ((short)uStack_276 < (short)uStack_26e) * uStack_26e |
                 ((short)uStack_276 >= (short)uStack_26e) * uStack_276;
  auVar1._0_2_ = ((short)local_278 < (short)uStack_270) * uStack_270 |
                 ((short)local_278 >= (short)uStack_270) * local_278;
  auVar1._4_2_ = ((short)uStack_274 < (short)uStack_26c) * uStack_26c |
                 ((short)uStack_274 >= (short)uStack_26c) * uStack_274;
  auVar1._6_2_ = ((short)uStack_272 < (short)uStack_26a) * uStack_26a |
                 ((short)uStack_272 >= (short)uStack_26a) * uStack_272;
  auVar1._10_2_ = (-1 < (short)uStack_26e) * uStack_26e;
  auVar1._8_2_ = (-1 < (short)uStack_270) * uStack_270;
  auVar1._12_2_ = (-1 < (short)uStack_26c) * uStack_26c;
  auVar1._14_2_ = (-1 < (short)uStack_26a) * uStack_26a;
  auVar1 = psubusw(auVar1,(undefined1  [16])*th);
  local_218 = auVar1._0_2_;
  sStack_216 = auVar1._2_2_;
  sStack_214 = auVar1._4_2_;
  sStack_212 = auVar1._6_2_;
  sStack_210 = auVar1._8_2_;
  sStack_20e = auVar1._10_2_;
  sStack_20c = auVar1._12_2_;
  sStack_20a = auVar1._14_2_;
  *(ushort *)*flat = -(ushort)(local_218 == 0);
  *(ushort *)((long)*flat + 2) = -(ushort)(sStack_216 == 0);
  *(ushort *)((long)*flat + 4) = -(ushort)(sStack_214 == 0);
  *(ushort *)((long)*flat + 6) = -(ushort)(sStack_212 == 0);
  *(ushort *)(*flat + 1) = -(ushort)(sStack_210 == 0);
  *(ushort *)((long)*flat + 10) = -(ushort)(sStack_20e == 0);
  *(ushort *)((long)*flat + 0xc) = -(ushort)(sStack_20c == 0);
  *(ushort *)((long)*flat + 0xe) = -(ushort)(sStack_20a == 0);
  return;
}

Assistant:

static inline void flat_mask_internal(const __m128i *th, const __m128i *pq,
                                      int start, int end, __m128i *flat) {
  int i;
  __m128i max = _mm_max_epi16(abs_diff16(pq[start], pq[0]),
                              abs_diff16(pq[start + 1], pq[0]));

  for (i = start + 2; i < end; ++i) {
    max = _mm_max_epi16(max, abs_diff16(pq[i], pq[0]));
  }
  max = _mm_max_epi16(max, _mm_srli_si128(max, 8));

  __m128i ft;
  ft = _mm_subs_epu16(max, *th);

  const __m128i zero = _mm_setzero_si128();
  *flat = _mm_cmpeq_epi16(ft, zero);
}